

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputable.cpp
# Opt level: O3

void snestistics::initLookupTables(void)

{
  char cVar1;
  char *__s1;
  int iVar2;
  undefined1 *puVar3;
  int ih;
  long lVar4;
  
  lVar4 = 0;
  do {
    (&jumps)[lVar4] = 0;
    (&branches)[lVar4] = 0;
    (&branches8)[lVar4] = 0;
    (&jump_or_branch)[lVar4] = 0;
    (&pushpops)[lVar4] = 0;
    __s1 = (char *)(&mnemonic_names)[lVar4];
    cVar1 = *__s1;
    if (cVar1 == 'B') {
      (&jump_or_branch)[lVar4] = 1;
      iVar2 = strcmp(__s1,"BRK");
      if (iVar2 != 0) {
        iVar2 = strcmp(__s1,"BIT");
        if (iVar2 != 0) {
          (&jumps)[lVar4] = 1;
          (&branches)[lVar4] = 1;
          iVar2 = strcmp(__s1,"BRL");
          if (iVar2 != 0) {
            puVar3 = &branches8 + lVar4;
            goto LAB_0012aeec;
          }
        }
      }
    }
    else if (cVar1 == 'P') {
      if ((byte)(__s1[1] | 4U) == 0x4c) {
        puVar3 = &pushpops + lVar4;
LAB_0012aeec:
        *puVar3 = 1;
      }
    }
    else if (cVar1 == 'J') {
      (&jumps)[lVar4] = 1;
      iVar2 = strcmp(__s1,"JMP");
      if (iVar2 == 0) {
        puVar3 = &jump_or_branch + lVar4;
        goto LAB_0012aeec;
      }
    }
    lVar4 = lVar4 + 1;
    if (lVar4 == 0x100) {
      return;
    }
  } while( true );
}

Assistant:

void initLookupTables() {
	for (int ih = 0; ih<256; ih++) {
		jumps[ih] = false;
		branches[ih] = false;
		branches8[ih] = false;
		jump_or_branch[ih]=false;
		pushpops[ih] = false;
		const char * const i = snestistics::mnemonic_names[ih];
		if (i[0] == 'J') {
			jumps[ih] = true;
			if (strcmp(i, "JMP")==0)
				jump_or_branch[ih] = true;
		}
		else if (i[0] == 'B') {
			jump_or_branch[ih] = true;
			if (strcmp(i, "BRK") == 0) continue;
			if (strcmp(i, "BIT") == 0) continue;
			jumps[ih] = true;
			branches[ih] = true;
			if (strcmp(i, "BRL") == 0) continue;
			branches8[ih] = true;
		} else if (i[0]=='P' && i[1]=='H') {
			pushpops[ih] = true;
		} else if (i[0]=='P' && i[1]=='L') {
			pushpops[ih] = true;
		}
	}
}